

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_float_with_real(void)

{
  undefined4 local_194;
  type_conflict8 local_190;
  undefined1 local_18b;
  undefined1 local_18a [2];
  basic_variable<std::allocator<char>_> local_188;
  undefined1 local_14b;
  undefined1 local_14a [2];
  undefined1 local_148 [8];
  variable data_2;
  type_conflict8 local_110;
  undefined1 local_10b;
  undefined1 local_10a [2];
  basic_variable<std::allocator<char>_> local_108;
  undefined1 local_cb;
  undefined1 local_ca [2];
  undefined1 local_c8 [8];
  variable data_1;
  type_conflict8 local_90;
  undefined1 local_8b;
  undefined1 local_8a [2];
  basic_variable<std::allocator<char>_> local_88;
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_38,3.0);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x39d,"void append_suite::append_float_with_real()",local_3a,&local_3b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_88,2.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_38,&local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_88);
  local_8a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_8b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x39f,"void append_suite::append_float_with_real()",local_8a,&local_8b);
  local_90 = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                       ((basic_variable<std::allocator<char>_> *)local_38);
  data_1.storage._44_4_ = 0x40a00000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","5.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x3a0,"void append_suite::append_float_with_real()",&local_90,
             &data_1.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_c8,3.0);
  local_ca[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                          ((basic_variable<std::allocator<char>_> *)local_c8);
  local_cb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x3a4,"void append_suite::append_float_with_real()",local_ca,&local_cb);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_108,2.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_c8,&local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_108);
  local_10a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                           ((basic_variable<std::allocator<char>_> *)local_c8);
  local_10b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x3a6,"void append_suite::append_float_with_real()",local_10a,&local_10b);
  local_110 = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                        ((basic_variable<std::allocator<char>_> *)local_c8);
  data_2.storage._44_4_ = 0x40a00000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","5.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x3a7,"void append_suite::append_float_with_real()",&local_110,
             &data_2.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_148,3.0);
  local_14a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                           ((basic_variable<std::allocator<char>_> *)local_148);
  local_14b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x3ab,"void append_suite::append_float_with_real()",local_14a,&local_14b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_188,(longdouble)2.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_148,&local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_188);
  local_18a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                           ((basic_variable<std::allocator<char>_> *)local_148);
  local_18b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x3ad,"void append_suite::append_float_with_real()",local_18a,&local_18b);
  local_190 = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                        ((basic_variable<std::allocator<char>_> *)local_148);
  local_194 = 0x40a00000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","5.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x3ae,"void append_suite::append_float_with_real()",&local_190,&local_194);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_148);
  return;
}

Assistant:

void append_float_with_real()
{
    {
        variable data(3.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
        data += variable(2.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), 5.0f);
    }
    {
        variable data(3.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
        data += variable(2.0);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), 5.0f);
    }
    {
        variable data(3.0f);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
        data += variable(2.0L);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), 5.0f);
    }
}